

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

int __thiscall cmCPackIFWPackage::ConfigureFromPrefix(cmCPackIFWPackage *this,string *prefix)

{
  pointer pbVar1;
  bool bVar2;
  char *pcVar3;
  reference pbVar4;
  size_type sVar5;
  size_type sVar6;
  pair<std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct_*>,_bool> pVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  allocator local_469;
  string local_468;
  undefined1 local_448 [8];
  string lowerValue;
  char *value_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  _Base_ptr local_3e0;
  undefined1 local_3d8;
  mapped_type *local_3d0;
  mapped_type *local_3c8;
  DependenceStruct *depRef_1;
  mapped_type *pmStack_3b8;
  bool hasDep_1;
  cmCPackIFWPackage *depPkg_1;
  DependenceStruct dep_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_360;
  iterator dit_1;
  string local_350;
  undefined1 local_330 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depsOn;
  char *value_8;
  _Base_ptr local_2f0;
  undefined1 local_2e8;
  mapped_type *local_2e0;
  mapped_type *local_2d8;
  DependenceStruct *depRef;
  mapped_type *pmStack_2c8;
  bool hasDep;
  cmCPackIFWPackage *depPkg;
  DependenceStruct dep;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  iterator dit;
  string local_260;
  char *local_240;
  char *value_7;
  allocator local_211;
  string local_210;
  char *local_1f0;
  char *value_6;
  undefined1 local_1c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deps;
  string local_1a8;
  char *local_188;
  char *value_5;
  char *local_160;
  char *value_4;
  char *local_138;
  char *value_3;
  char *local_110;
  char *value_2;
  allocator local_e1;
  string local_e0;
  char *local_c0;
  char *value_1;
  allocator local_91;
  string local_90;
  char *local_70;
  char *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string option;
  string *prefix_local;
  cmCPackIFWPackage *this_local;
  
  option.field_2._8_8_ = prefix;
  std::__cxx11::string::string((string *)local_38);
  std::operator+(&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"DISPLAY_NAME");
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar2 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar2) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&this->DisplayName);
  }
  else {
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    local_70 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_90,pcVar3,&local_91);
      cmCPackIFWCommon::ExpandListArgument(&local_90,&this->DisplayName);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"DESCRIPTION");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_1);
  std::__cxx11::string::~string((string *)&value_1);
  bVar2 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar2) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&this->Description);
  }
  else {
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    local_c0 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e0,pcVar3,&local_e1);
      cmCPackIFWCommon::ExpandListArgument(&local_e0,&this->Description);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"RELEASE_DATE");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_2);
  std::__cxx11::string::~string((string *)&value_2);
  bVar2 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar2) {
    std::__cxx11::string::clear();
  }
  else {
    local_110 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    if (local_110 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->ReleaseDate,local_110);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"SORTING_PRIORITY");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_3);
  std::__cxx11::string::~string((string *)&value_3);
  bVar2 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar2) {
    std::__cxx11::string::clear();
  }
  else {
    local_138 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    if (local_138 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->SortingPriority,local_138);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"UPDATE_TEXT");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_4);
  std::__cxx11::string::~string((string *)&value_4);
  bVar2 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar2) {
    std::__cxx11::string::clear();
  }
  else {
    local_160 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    if (local_160 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->UpdateText,local_160);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"TRANSLATIONS");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_5);
  std::__cxx11::string::~string((string *)&value_5);
  bVar2 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this->Translations);
  }
  else {
    local_188 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    if (local_188 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->Translations);
      pcVar3 = local_188;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1a8,pcVar3,
                 (allocator *)
                 ((long)&deps.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      cmSystemTools::ExpandListArgument(&local_1a8,&this->Translations,false);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&deps.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_6,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"DEPENDS");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_6);
  std::__cxx11::string::~string((string *)&value_6);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
  local_1f0 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_210,pcVar3,&local_211);
    cmSystemTools::ExpandListArgument
              (&local_210,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1c8,false);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_7,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"DEPENDENCIES");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_7);
  std::__cxx11::string::~string((string *)&value_7);
  pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
  local_240 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_260,pcVar3,(allocator *)((long)&dit._M_current + 7));
    cmSystemTools::ExpandListArgument
              (&local_260,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1c8,false);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dit._M_current + 7));
  }
  local_270._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1c8);
  while( true ) {
    dep.Compare.Value.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1c8);
    bVar2 = __gnu_cxx::operator!=
                      (&local_270,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&dep.Compare.Value.field_2 + 8));
    if (!bVar2) break;
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_270);
    DependenceStruct::DependenceStruct((DependenceStruct *)&depPkg,pbVar4);
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
            ::count(&((this->super_cmCPackIFWCommon).Generator)->Packages,(key_type *)&depPkg);
    if (sVar5 != 0) {
      pmStack_2c8 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                    ::operator[](&((this->super_cmCPackIFWCommon).Generator)->Packages,
                                 (key_type *)&depPkg);
      std::__cxx11::string::operator=((string *)&depPkg,(string *)&pmStack_2c8->Name);
    }
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
            ::count(&((this->super_cmCPackIFWCommon).Generator)->DependentPackages,
                    (key_type *)&depPkg);
    depRef._7_1_ = sVar6 != 0;
    local_2d8 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                ::operator[](&((this->super_cmCPackIFWCommon).Generator)->DependentPackages,
                             (key_type *)&depPkg);
    if ((depRef._7_1_ & 1) == 0) {
      DependenceStruct::operator=(local_2d8,(DependenceStruct *)&depPkg);
    }
    local_2e0 = local_2d8;
    pVar7 = std::
            set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
            ::insert(&this->AlienDependencies,&local_2e0);
    local_2f0 = (_Base_ptr)pVar7.first._M_node;
    local_2e8 = pVar7.second;
    DependenceStruct::~DependenceStruct((DependenceStruct *)&depPkg);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_270);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"AUTO_DEPEND_ON");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_8);
  std::__cxx11::string::~string((string *)&value_8);
  bVar2 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar2) {
    std::
    set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
    ::clear(&this->AlienAutoDependOn);
  }
  else {
    depsOn.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    if (depsOn.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_330);
      pbVar1 = depsOn.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_350,(char *)pbVar1,(allocator *)((long)&dit_1._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_350,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_330,false);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator((allocator<char> *)((long)&dit_1._M_current + 7));
      local_360._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_330);
      while( true ) {
        dep_1.Compare.Value.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_330);
        bVar2 = __gnu_cxx::operator!=
                          (&local_360,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&dep_1.Compare.Value.field_2 + 8));
        if (!bVar2) break;
        pbVar4 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_360);
        DependenceStruct::DependenceStruct((DependenceStruct *)&depPkg_1,pbVar4);
        sVar5 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                ::count(&((this->super_cmCPackIFWCommon).Generator)->Packages,(key_type *)&depPkg_1)
        ;
        if (sVar5 != 0) {
          pmStack_3b8 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                        ::operator[](&((this->super_cmCPackIFWCommon).Generator)->Packages,
                                     (key_type *)&depPkg_1);
          std::__cxx11::string::operator=((string *)&depPkg_1,(string *)&pmStack_3b8->Name);
        }
        sVar6 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                ::count(&((this->super_cmCPackIFWCommon).Generator)->DependentPackages,
                        (key_type *)&depPkg_1);
        depRef_1._7_1_ = sVar6 != 0;
        local_3c8 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                    ::operator[](&((this->super_cmCPackIFWCommon).Generator)->DependentPackages,
                                 (key_type *)&depPkg_1);
        if ((depRef_1._7_1_ & 1) == 0) {
          DependenceStruct::operator=(local_3c8,(DependenceStruct *)&depPkg_1);
        }
        local_3d0 = local_3c8;
        pVar7 = std::
                set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
                ::insert(&this->AlienAutoDependOn,&local_3d0);
        local_3e0 = (_Base_ptr)pVar7.first._M_node;
        local_3d8 = pVar7.second;
        DependenceStruct::~DependenceStruct((DependenceStruct *)&depPkg_1);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_360);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_330);
    }
  }
  std::operator+(&local_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"VIRTUAL");
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  bVar2 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar2) {
    std::__cxx11::string::clear();
  }
  else {
    bVar2 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)local_38);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)&this->Virtual,"true");
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_9,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"DEFAULT");
  std::__cxx11::string::operator=((string *)local_38,(string *)&value_9);
  std::__cxx11::string::~string((string *)&value_9);
  bVar2 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar2) {
    std::__cxx11::string::clear();
  }
  else {
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_38);
    lowerValue.field_2._8_8_ = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_468,pcVar3,&local_469);
      cmsys::SystemTools::LowerCase((string *)local_448,&local_468);
      std::__cxx11::string::~string((string *)&local_468);
      std::allocator<char>::~allocator((allocator<char> *)&local_469);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_448,"true");
      if (bVar2) {
        std::__cxx11::string::operator=((string *)&this->Default,"true");
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_448,"false");
        if (bVar2) {
          std::__cxx11::string::operator=((string *)&this->Default,"false");
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_448,"script");
          if (bVar2) {
            std::__cxx11::string::operator=((string *)&this->Default,"script");
          }
          else {
            std::__cxx11::string::operator=
                      ((string *)&this->Default,(char *)lowerValue.field_2._8_8_);
          }
        }
      }
      std::__cxx11::string::~string((string *)local_448);
    }
  }
  std::operator+(&local_490,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"FORCED_INSTALLATION");
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  bVar2 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar2) {
    std::__cxx11::string::clear();
  }
  else {
    bVar2 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)local_38);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)&this->ForcedInstallation,"true");
    }
    else {
      bVar2 = cmCPackIFWCommon::IsSetToOff(&this->super_cmCPackIFWCommon,(string *)local_38);
      if (bVar2) {
        std::__cxx11::string::operator=((string *)&this->ForcedInstallation,"false");
      }
    }
  }
  std::operator+(&local_4b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 option.field_2._8_8_,"REQUIRES_ADMIN_RIGHTS");
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  bVar2 = cmCPackIFWCommon::IsSetToEmpty(&this->super_cmCPackIFWCommon,(string *)local_38);
  if (bVar2) {
    std::__cxx11::string::clear();
  }
  else {
    bVar2 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)local_38);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)&this->RequiresAdminRights,"true");
    }
    else {
      bVar2 = cmCPackIFWCommon::IsSetToOff(&this->super_cmCPackIFWCommon,(string *)local_38);
      if (bVar2) {
        std::__cxx11::string::operator=((string *)&this->RequiresAdminRights,"false");
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1c8);
  std::__cxx11::string::~string((string *)local_38);
  return 1;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromPrefix(const std::string& prefix)
{
  // Temporary variable for full option name
  std::string option;

  // Display name
  option = prefix + "DISPLAY_NAME";
  if (this->IsSetToEmpty(option)) {
    this->DisplayName.clear();
  } else if (const char* value = this->GetOption(option)) {
    this->ExpandListArgument(value, this->DisplayName);
  }

  // Description
  option = prefix + "DESCRIPTION";
  if (this->IsSetToEmpty(option)) {
    this->Description.clear();
  } else if (const char* value = this->GetOption(option)) {
    this->ExpandListArgument(value, this->Description);
  }

  // Release date
  option = prefix + "RELEASE_DATE";
  if (this->IsSetToEmpty(option)) {
    this->ReleaseDate.clear();
  } else if (const char* value = this->GetOption(option)) {
    this->ReleaseDate = value;
  }

  // Sorting priority
  option = prefix + "SORTING_PRIORITY";
  if (this->IsSetToEmpty(option)) {
    this->SortingPriority.clear();
  } else if (const char* value = this->GetOption(option)) {
    this->SortingPriority = value;
  }

  // Update text
  option = prefix + "UPDATE_TEXT";
  if (this->IsSetToEmpty(option)) {
    this->UpdateText.clear();
  } else if (const char* value = this->GetOption(option)) {
    this->UpdateText = value;
  }

  // Translations
  option = prefix + "TRANSLATIONS";
  if (this->IsSetToEmpty(option)) {
    this->Translations.clear();
  } else if (const char* value = this->GetOption(option)) {
    this->Translations.clear();
    cmSystemTools::ExpandListArgument(value, this->Translations);
  }

  // QtIFW dependencies
  std::vector<std::string> deps;
  option = prefix + "DEPENDS";
  if (const char* value = this->GetOption(option)) {
    cmSystemTools::ExpandListArgument(value, deps);
  }
  option = prefix + "DEPENDENCIES";
  if (const char* value = this->GetOption(option)) {
    cmSystemTools::ExpandListArgument(value, deps);
  }
  for (std::vector<std::string>::iterator dit = deps.begin();
       dit != deps.end(); ++dit) {
    DependenceStruct dep(*dit);
    if (this->Generator->Packages.count(dep.Name)) {
      cmCPackIFWPackage& depPkg = this->Generator->Packages[dep.Name];
      dep.Name = depPkg.Name;
    }
    bool hasDep = this->Generator->DependentPackages.count(dep.Name) > 0;
    DependenceStruct& depRef = this->Generator->DependentPackages[dep.Name];
    if (!hasDep) {
      depRef = dep;
    }
    this->AlienDependencies.insert(&depRef);
  }

  // Automatic dependency on
  option = prefix + "AUTO_DEPEND_ON";
  if (this->IsSetToEmpty(option)) {
    this->AlienAutoDependOn.clear();
  } else if (const char* value = this->GetOption(option)) {
    std::vector<std::string> depsOn;
    cmSystemTools::ExpandListArgument(value, depsOn);
    for (std::vector<std::string>::iterator dit = depsOn.begin();
         dit != depsOn.end(); ++dit) {
      DependenceStruct dep(*dit);
      if (this->Generator->Packages.count(dep.Name)) {
        cmCPackIFWPackage& depPkg = this->Generator->Packages[dep.Name];
        dep.Name = depPkg.Name;
      }
      bool hasDep = this->Generator->DependentPackages.count(dep.Name) > 0;
      DependenceStruct& depRef = this->Generator->DependentPackages[dep.Name];
      if (!hasDep) {
        depRef = dep;
      }
      this->AlienAutoDependOn.insert(&depRef);
    }
  }

  // Visibility
  option = prefix + "VIRTUAL";
  if (this->IsSetToEmpty(option)) {
    this->Virtual.clear();
  } else if (this->IsOn(option)) {
    this->Virtual = "true";
  }

  // Default selection
  option = prefix + "DEFAULT";
  if (this->IsSetToEmpty(option)) {
    this->Default.clear();
  } else if (const char* value = this->GetOption(option)) {
    std::string lowerValue = cmsys::SystemTools::LowerCase(value);
    if (lowerValue == "true") {
      this->Default = "true";
    } else if (lowerValue == "false") {
      this->Default = "false";
    } else if (lowerValue == "script") {
      this->Default = "script";
    } else {
      this->Default = value;
    }
  }

  // Forsed installation
  option = prefix + "FORCED_INSTALLATION";
  if (this->IsSetToEmpty(option)) {
    this->ForcedInstallation.clear();
  } else if (this->IsOn(option)) {
    this->ForcedInstallation = "true";
  } else if (this->IsSetToOff(option)) {
    this->ForcedInstallation = "false";
  }

  // Requires admin rights
  option = prefix + "REQUIRES_ADMIN_RIGHTS";
  if (this->IsSetToEmpty(option)) {
    this->RequiresAdminRights.clear();
  } else if (this->IsOn(option)) {
    this->RequiresAdminRights = "true";
  } else if (this->IsSetToOff(option)) {
    this->RequiresAdminRights = "false";
  }

  return 1;
}